

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_helpers.cpp
# Opt level: O3

vector<unsigned_long,_true> *
duckdb::ParseColumnsOrdered
          (vector<unsigned_long,_true> *__return_storage_ptr__,Value *value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,string *loption)

{
  LogicalTypeId LVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  int iVar4;
  vector<duckdb::Value,_true> *this;
  const_reference pvVar5;
  BinderException *this_00;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 local_88 [16];
  pointer local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar12;
  
  local_88 = (undefined1  [16])0x0;
  local_78 = (pointer)0x0;
  LVar1 = (value->type_).id_;
  if (LVar1 == LIST) {
    this = ListValue::GetChildren(value);
    if (((long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start == 0x40) &&
       (pvVar5 = vector<duckdb::Value,_true>::operator[](this,0), (pvVar5->type_).id_ == VARCHAR)) {
      pvVar5 = vector<duckdb::Value,_true>::operator[](this,0);
      Value::GetValue<std::__cxx11::string>(&local_70,pvVar5);
      iVar4 = ::std::__cxx11::string::compare((char *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (iVar4 == 0) {
        local_70._M_dataplus._M_p = (pointer)0x0;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,
                   (long)(names->
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(names->
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5,
                   (value_type_conflict *)&local_70);
        auVar3 = _DAT_01d99b10;
        if (local_88._0_8_ != local_88._8_8_) {
          uVar6 = local_88._8_8_ + (-8 - local_88._0_8_);
          auVar14._8_4_ = (int)uVar6;
          auVar14._0_8_ = uVar6;
          auVar14._12_4_ = (int)(uVar6 >> 0x20);
          auVar10._0_8_ = uVar6 >> 3;
          auVar10._8_8_ = auVar14._8_8_ >> 3;
          uVar7 = 0;
          auVar10 = auVar10 ^ _DAT_01d99b10;
          auVar13 = _DAT_01d99b00;
          do {
            auVar14 = auVar13 ^ auVar3;
            if ((bool)(~(auVar14._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar14._0_4_ ||
                        auVar10._4_4_ < auVar14._4_4_) & 1)) {
              *(ulong *)(local_88._0_8_ + uVar7 * 8) = uVar7;
            }
            if ((auVar14._12_4_ != auVar10._12_4_ || auVar14._8_4_ <= auVar10._8_4_) &&
                auVar14._12_4_ <= auVar10._12_4_) {
              *(ulong *)(local_88._0_8_ + (uVar7 + 1) * 8) = uVar7 + 1;
            }
            uVar7 = uVar7 + 2;
            lVar12 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 2;
            auVar13._8_8_ = lVar12 + 2;
          } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
        }
        goto LAB_013d0925;
      }
    }
    ParseColumnsOrdered(__return_storage_ptr__,this,names,loption);
    if ((pointer)local_88._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  else {
    if (LVar1 != VARCHAR) {
LAB_013d0aaf:
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"\"%s\" expects a column list or * as parameter","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar2 = (loption->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + loption->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(this_00,&local_70,&local_50);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::GetValue<std::__cxx11::string>(&local_70,value);
    iVar4 = ::std::__cxx11::string::compare((char *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (iVar4 != 0) goto LAB_013d0aaf;
    local_70._M_dataplus._M_p = (pointer)0x0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,
               (long)(names->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(names->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type_conflict *)&local_70
              );
    auVar3 = _DAT_01d99b10;
    if (local_88._0_8_ != local_88._8_8_) {
      uVar6 = local_88._8_8_ + (-8 - local_88._0_8_);
      auVar8._8_4_ = (int)uVar6;
      auVar8._0_8_ = uVar6;
      auVar8._12_4_ = (int)(uVar6 >> 0x20);
      auVar9._0_8_ = uVar6 >> 3;
      auVar9._8_8_ = auVar8._8_8_ >> 3;
      uVar7 = 0;
      auVar9 = auVar9 ^ _DAT_01d99b10;
      auVar11 = _DAT_01d99b00;
      do {
        auVar13 = auVar11 ^ auVar3;
        if ((bool)(~(auVar13._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar13._0_4_ ||
                    auVar9._4_4_ < auVar13._4_4_) & 1)) {
          *(ulong *)(local_88._0_8_ + uVar7 * 8) = uVar7;
        }
        if ((auVar13._12_4_ != auVar9._12_4_ || auVar13._8_4_ <= auVar9._8_4_) &&
            auVar13._12_4_ <= auVar9._12_4_) {
          *(ulong *)(local_88._0_8_ + (uVar7 + 1) * 8) = uVar7 + 1;
        }
        uVar7 = uVar7 + 2;
        lVar12 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar12 + 2;
      } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
    }
LAB_013d0925:
    (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
    (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
    (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_78;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<idx_t> ParseColumnsOrdered(const Value &value, vector<string> &names, const string &loption) {
	vector<idx_t> result;

	// Only accept a list of arguments
	if (value.type().id() != LogicalTypeId::LIST) {
		// Support a single argument if it's '*'
		if (value.type().id() == LogicalTypeId::VARCHAR && value.GetValue<string>() == "*") {
			result.resize(names.size(), 0);
			std::iota(std::begin(result), std::end(result), 0);
			return result;
		}
		throw BinderException("\"%s\" expects a column list or * as parameter", loption);
	}
	auto &children = ListValue::GetChildren(value);
	// accept '*' as single argument
	if (children.size() == 1 && children[0].type().id() == LogicalTypeId::VARCHAR &&
	    children[0].GetValue<string>() == "*") {
		result.resize(names.size(), 0);
		std::iota(std::begin(result), std::end(result), 0);
		return result;
	}
	return ParseColumnsOrdered(children, names, loption);
}